

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestResults.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_37e72::TestRecordsNumbersOfTests::RunImpl(TestRecordsNumbersOfTests *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  int local_50 [2];
  TestDetails local_48;
  TestResults results;
  
  UnitTest::TestResults::TestResults(&results,(TestReporter *)0x0);
  UnitTest::TestResults::OnTestStart(&results,(TestDetails *)(anonymous_namespace)::details);
  UnitTest::TestResults::OnTestStart(&results,(TestDetails *)(anonymous_namespace)::details);
  UnitTest::TestResults::OnTestStart(&results,(TestDetails *)(anonymous_namespace)::details);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_50[1] = 3;
  local_50[0] = UnitTest::TestResults::GetTotalTestCount(&results);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_48,*ppTVar2,0x18);
  UnitTest::CheckEqual<int,int>(results_00,local_50 + 1,local_50,&local_48);
  return;
}

Assistant:

TEST(RecordsNumbersOfTests)
{
    TestResults results;
    results.OnTestStart(details);
    results.OnTestStart(details);
    results.OnTestStart(details);
    CHECK_EQUAL(3, results.GetTotalTestCount());
}